

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<char,_false,_false>::grow_and_add
          (FastVector<char,_false,_false> *this,uint newSize,char *val)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  
  pcVar3 = this->data;
  grow_no_destroy(this,newSize);
  cVar1 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = cVar1;
  if (pcVar3 != (char *)0x0) {
    (*(code *)NULLC::dealloc)(pcVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}